

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

external_ip * __thiscall
libtorrent::aux::session_impl::external_address
          (external_ip *__return_storage_ptr__,session_impl *this)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  address *local_140;
  address local_138;
  undefined1 local_118 [8];
  address local_addr;
  undefined1 local_d8 [8];
  address external_addr;
  shared_ptr<libtorrent::aux::listen_socket_t> *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range2;
  address ips [2] [2];
  session_impl *this_local;
  
  local_140 = (address *)&__range2;
  ips[1][1].ipv6_address_.scope_id_ = (unsigned_long)this;
  do {
    boost::asio::ip::address::address(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != (address *)&ips[1][1].ipv6_address_.scope_id_);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ::begin(&this->m_listen_sockets);
  i = (shared_ptr<libtorrent::aux::listen_socket_t> *)
      ::std::
      vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ::end(&this->m_listen_sockets);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                     *)&i), bVar1) {
    external_addr.ipv6_address_.scope_id_ =
         (unsigned_long)
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
         ::operator*(&__end2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)external_addr.ipv6_address_.scope_id_);
    ip_voter::external_address((address *)local_d8,&peVar3->external_address);
    bVar1 = boost::asio::ip::address::is_v6((address *)local_d8);
    boost::asio::ip::address::address((address *)&local_addr.ipv6_address_.scope_id_);
    bVar1 = boost::asio::ip::operator==
                      ((address *)&ips[-1][(ulong)bVar1 + 1].ipv6_address_.scope_id_,
                       (address *)&local_addr.ipv6_address_.scope_id_);
    if (bVar1) {
      bVar1 = boost::asio::ip::address::is_v6((address *)local_d8);
      boost::asio::ip::address::operator=
                ((address *)&ips[-1][(ulong)bVar1 + 1].ipv6_address_.scope_id_,(address *)local_d8);
    }
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)external_addr.ipv6_address_.scope_id_);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              ((address *)local_118,&peVar3->local_endpoint);
    bVar1 = is_local((address *)local_118);
    bVar2 = boost::asio::ip::address::is_v6((address *)local_118);
    boost::asio::ip::address::address(&local_138);
    bVar1 = boost::asio::ip::operator==
                      ((address *)&ips[(ulong)bVar1 - 1][(ulong)bVar2 + 1].ipv6_address_.scope_id_,
                       &local_138);
    if (bVar1) {
      bVar1 = is_local((address *)local_118);
      bVar2 = boost::asio::ip::address::is_v6((address *)local_118);
      boost::asio::ip::address::operator=
                ((address *)&ips[(ulong)bVar1 - 1][(ulong)bVar2 + 1].ipv6_address_.scope_id_,
                 (address *)local_118);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
    ::operator++(&__end2);
  }
  external_ip::external_ip
            (__return_storage_ptr__,(address *)&ips[0][1].ipv6_address_.scope_id_,
             (address *)&__range2,(address *)&ips[1][0].ipv6_address_.scope_id_,
             (address *)&ips[0][0].ipv6_address_.scope_id_);
  return __return_storage_ptr__;
}

Assistant:

aux::external_ip session_impl::external_address() const
	{
		address ips[2][2];

		// take the first IP we find which matches each category
		for (auto const& i : m_listen_sockets)
		{
			address external_addr = i->external_address.external_address();
			if (ips[0][external_addr.is_v6()] == address())
				ips[0][external_addr.is_v6()] = external_addr;
			address local_addr = i->local_endpoint.address();
			if (ips[is_local(local_addr)][local_addr.is_v6()] == address())
				ips[is_local(local_addr)][local_addr.is_v6()] = local_addr;
		}

		return {ips[1][0], ips[0][0], ips[1][1], ips[0][1]};
	}